

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  undefined8 uVar1;
  code *pcVar2;
  long lVar3;
  FILE *__stream;
  int iVar4;
  uint32 uVar5;
  int *piVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  char **in_RCX;
  long lVar10;
  char **ppcVar11;
  uint in_R8D;
  long lStack_50;
  undefined8 local_48;
  int stdoutFds [2];
  int stderrFds [2];
  int stdinFds [2];
  
  ppcVar11 = (char **)&local_48;
  if (this->pid != 0) {
    lStack_50 = 0x1091cc;
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    return 0;
  }
  local_48 = 0;
  stdoutFds[0] = 0;
  stdoutFds[1] = 0;
  stderrFds[0] = 0;
  stderrFds[1] = 0;
  if ((in_R8D & 1) == 0) {
LAB_0010920a:
    if ((in_R8D & 2) != 0) {
      lStack_50 = 0x109219;
      iVar4 = pipe(stdoutFds);
      if (iVar4 != 0) goto LAB_00109230;
    }
    if ((in_R8D & 4) != 0) {
      lStack_50 = 0x10922c;
      iVar4 = pipe(stderrFds);
      if (iVar4 != 0) goto LAB_00109230;
    }
    if ((__oflag == 0) || (in_RCX[(long)__oflag + -1] != (char *)0x0)) {
      lVar7 = (long)(int)(__oflag + (uint)(__oflag == 0));
      lVar3 = -(lVar7 * 8 + 0x17U & 0xfffffffffffffff0);
      ppcVar11 = (char **)((long)stdoutFds + lVar3 + -8);
      ppcVar11[lVar7] = (char *)0x0;
      *(undefined8 *)((long)&lStack_50 + lVar3) = 1;
      for (lVar10 = *(long *)((long)&lStack_50 + lVar3); lVar10 < lVar7; lVar10 = lVar10 + 1) {
        ppcVar11[lVar10] = in_RCX[lVar10];
      }
      *(undefined8 *)((long)&lStack_50 + lVar3) = 0x1092e1;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      *ppcVar11 = pcVar8;
      in_RCX = ppcVar11;
    }
    ppcVar11[-1] = (char *)0x1092ed;
    uVar5 = vfork();
    if (uVar5 != 0xffffffff) {
      iVar4 = local_48._4_4_;
      if (uVar5 != 0) {
        this->pid = uVar5;
        if (local_48._4_4_ != 0) {
          ppcVar11[-1] = (char *)0x1093b7;
          ::close(iVar4);
        }
        iVar4 = stdoutFds[1];
        if (stdoutFds[1] != 0) {
          ppcVar11[-1] = (char *)0x1093c3;
          ::close(iVar4);
        }
        iVar4 = stderrFds[0];
        if (stderrFds[0] != 0) {
          ppcVar11[-1] = (char *)0x1093cf;
          ::close(iVar4);
        }
        this->fdStdOutRead = (int)local_48;
        this->fdStdErrRead = stdoutFds[0];
        this->fdStdInWrite = stderrFds[1];
        return (int)CONCAT71((int7)((ulong)__file >> 8),1);
      }
      if (local_48._4_4_ != 0) {
        ppcVar11[-1] = (char *)0x1;
        uVar1 = ppcVar11[-1];
        ppcVar11[-1] = (char *)0x109309;
        dup2(iVar4,(int)uVar1);
        iVar4 = local_48._4_4_;
        ppcVar11[-1] = (char *)0x109311;
        ::close(iVar4);
      }
      iVar4 = stdoutFds[1];
      if (stdoutFds[1] != 0) {
        ppcVar11[-1] = (char *)0x2;
        uVar1 = ppcVar11[-1];
        ppcVar11[-1] = (char *)0x109320;
        dup2(iVar4,(int)uVar1);
        iVar4 = stdoutFds[1];
        ppcVar11[-1] = (char *)0x109328;
        ::close(iVar4);
      }
      iVar4 = stderrFds[0];
      if (stderrFds[0] != 0) {
        ppcVar11[-1] = (char *)0x109336;
        dup2(iVar4,0);
        iVar4 = stderrFds[0];
        ppcVar11[-1] = (char *)0x10933e;
        ::close(iVar4);
      }
      iVar4 = (int)local_48;
      if ((int)local_48 != 0) {
        ppcVar11[-1] = (char *)0x10934a;
        ::close(iVar4);
      }
      iVar4 = stdoutFds[0];
      if (stdoutFds[0] != 0) {
        ppcVar11[-1] = (char *)0x109356;
        ::close(iVar4);
      }
      iVar4 = stderrFds[1];
      if (stderrFds[1] != 0) {
        ppcVar11[-1] = (char *)0x109362;
        ::close(iVar4);
      }
      ppcVar11[-1] = (char *)0x10936a;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      ppcVar11[-1] = (char *)0x109375;
      iVar4 = execvp(pcVar8,in_RCX);
      __stream = _stderr;
      if (iVar4 != -1) {
        ppcVar11[-1] = (char *)0x10939d;
        iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Process.cpp"
                              ,0x2a5,"false");
        if (iVar4 == 0) {
          return 0;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppcVar11[-1] = (char *)0x1093fc;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      ppcVar11[-1] = (char *)0x109404;
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      ppcVar11[-1] = (char *)0x10940b;
      pcVar9 = strerror(iVar4);
      ppcVar11[-1] = (char *)0x109422;
      fprintf(__stream,"%s: %s\n",pcVar8,pcVar9);
      ppcVar11[-1] = (char *)0x1;
      uVar1 = ppcVar11[-1];
      ppcVar11[-1] = (char *)open;
      _exit((int)uVar1);
    }
  }
  else {
    lStack_50 = 0x109206;
    iVar4 = pipe((int *)&local_48);
    if (iVar4 == 0) goto LAB_0010920a;
LAB_00109230:
    lStack_50 = 0x109235;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    if ((int)local_48 != 0) {
      lStack_50 = 0x109247;
      ::close((int)local_48);
      lStack_50 = 0x10924f;
      ::close(local_48._4_4_);
    }
    if (stdoutFds[0] != 0) {
      lStack_50 = 0x10925b;
      ::close(stdoutFds[0]);
      lStack_50 = 0x109263;
      ::close(stdoutFds[1]);
    }
    if (stderrFds[0] != 0) {
      lStack_50 = 0x10926f;
      ::close(stderrFds[0]);
      lStack_50 = 0x109277;
      ::close(stderrFds[1]);
    }
    *piVar6 = iVar4;
  }
  return 0;
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  // prepare argv of child
  const char** args;
  if (argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if (!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = executable;
  }

  // start process
  {
    int r = vfork();
    if (r == -1)
      return false;
    else if (r != 0) // parent
    {
      pid = r;

      if (stdoutFds[1])
        ::close(stdoutFds[1]);
      if (stderrFds[1])
        ::close(stderrFds[1]);
      if (stdinFds[0])
        ::close(stdinFds[0]);

      fdStdOutRead = stdoutFds[0];
      fdStdErrRead = stderrFds[0];
      fdStdInWrite = stdinFds[1];

      return true;
    }
    else // child
    {
      if (stdoutFds[1])
      {
        dup2(stdoutFds[1], STDOUT_FILENO);
        ::close(stdoutFds[1]);
      }
      if (stderrFds[1])
      {
        dup2(stderrFds[1], STDERR_FILENO);
        ::close(stderrFds[1]);
      }
      if (stdinFds[0])
      {
        dup2(stdinFds[0], STDIN_FILENO);
        ::close(stdinFds[0]);
      }

      if (stdoutFds[0])
        ::close(stdoutFds[0]);
      if (stderrFds[0])
        ::close(stderrFds[0]);
      if (stdinFds[1])
        ::close(stdinFds[1]);

      if (execvp(executable, (char* const*)args) == -1)
      {
        fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
        _exit(EXIT_FAILURE);
      }
      ASSERT(false); // unreachable
      return false;
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}